

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

bool __thiscall LinkedObjectFile::is_empty_list(LinkedObjectFile *this,int seg,int byte_idx)

{
  reference this_00;
  reference pvVar1;
  
  if ((byte_idx & 3U) == 0) {
    this_00 = std::
              vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
              ::at(&this->words_by_seg,(long)seg);
    pvVar1 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at(this_00,(long)(byte_idx >> 2))
    ;
    return pvVar1->kind == EMPTY_PTR;
  }
  __assert_fail("(byte_idx % 4) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                ,0x2aa,"bool LinkedObjectFile::is_empty_list(int, int)");
}

Assistant:

bool LinkedObjectFile::is_empty_list(int seg, int byte_idx) {
  assert((byte_idx % 4) == 0);
  auto& word = words_by_seg.at(seg).at(byte_idx / 4);
  return word.kind == LinkedWord::EMPTY_PTR;
}